

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scapp.h
# Opt level: O1

void __thiscall scApp::commandOptions::astcOptions::astcOptions(astcOptions *this)

{
  uint uVar1;
  uint *puVar2;
  int iVar3;
  uint uVar4;
  
  (this->threadCount).option = &(this->super_ktxAstcParams).threadCount;
  (this->threadCount).min = 1;
  (this->threadCount).max = 10000;
  (this->blockDimension).option = &(this->super_ktxAstcParams).blockDimension;
  (this->blockDimension).min = 0;
  (this->blockDimension).max = 0x17;
  (this->mode).option = &(this->super_ktxAstcParams).mode;
  (this->mode).min = 0;
  (this->mode).max = 2;
  (this->qualityLevel).option = &(this->super_ktxAstcParams).qualityLevel;
  (this->qualityLevel).min = 0;
  (this->qualityLevel).max = 100;
  iVar3 = std::thread::hardware_concurrency();
  uVar4 = iVar3 + (uint)(iVar3 == 0);
  (this->threadCount).max = uVar4;
  uVar1 = (this->threadCount).min;
  if (uVar4 < uVar1) {
    uVar4 = uVar1;
  }
  *(this->threadCount).option = uVar4;
  (this->super_ktxAstcParams).structSize = 0x20;
  puVar2 = (this->blockDimension).option;
  *puVar2 = 0;
  uVar1 = (this->blockDimension).max;
  uVar4 = 4;
  if (uVar1 < 4) {
    uVar4 = uVar1;
  }
  uVar1 = (this->blockDimension).min;
  if (4 < uVar1) {
    uVar4 = uVar1;
  }
  *puVar2 = uVar4;
  *(this->mode).option = 0;
  *(this->qualityLevel).option = 0;
  (this->super_ktxAstcParams).normalMap = false;
  (this->super_ktxAstcParams).inputSwizzle[0] = '\0';
  (this->super_ktxAstcParams).inputSwizzle[1] = '\0';
  (this->super_ktxAstcParams).inputSwizzle[2] = '\0';
  (this->super_ktxAstcParams).inputSwizzle[3] = '\0';
  return;
}

Assistant:

astcOptions() :
                threadCount(ktxAstcParams::threadCount, 1, 10000),
                blockDimension(ktxAstcParams::blockDimension, 0, KTX_PACK_ASTC_BLOCK_DIMENSION_MAX),
                mode(ktxAstcParams::mode, 0, KTX_PACK_ASTC_ENCODER_MODE_MAX),
                qualityLevel(ktxAstcParams::qualityLevel, 0, KTX_PACK_ASTC_QUALITY_LEVEL_MAX)
            {
                uint32_t tc = thread::hardware_concurrency();
                if (tc == 0) tc = 1;
                threadCount.max = tc;
                threadCount = tc;

                structSize = sizeof(ktxAstcParams);
                blockDimension.clear();
                blockDimension = KTX_PACK_ASTC_BLOCK_DIMENSION_6x6;
                mode.clear();
                qualityLevel.clear();
                normalMap = false;
                for (int i = 0; i < 4; i++) inputSwizzle[i] = 0;
            }